

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

void __thiscall
Indexing::CodeTree::Compiler<false>::handleVar
          (Compiler<false> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  int iVar1;
  CodeOp elem;
  bool bVar2;
  undefined8 *in_RDI;
  CodeOp CVar3;
  uint *varNumPtr;
  Stack<Indexing::CodeTree::CodeOp> *in_stack_ffffffffffffffb0;
  Stack<Indexing::CodeTree::CodeOp> *this_00;
  CodeOp *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffcc;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_ffffffffffffffd0;
  int *local_20;
  
  bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     (uint **)in_stack_ffffffffffffffc0);
  if (bVar2) {
    iVar1 = *(int *)(in_RDI + 1);
    *(int *)(in_RDI + 1) = iVar1 + 1;
    *local_20 = iVar1;
    this_00 = (Stack<Indexing::CodeTree::CodeOp> *)*in_RDI;
    CodeOp::getTermOp((Instruction)((ulong)this_00 >> 0x20),(uint)this_00);
    CVar3._alternative = in_stack_ffffffffffffffc0;
    CVar3._content = (uint64_t)in_RDI;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(this_00,CVar3);
  }
  else {
    CVar3 = CodeOp::getTermOp((Instruction)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (uint)in_stack_ffffffffffffffb0);
    elem._alternative = (CodeOp *)CVar3._content;
    elem._content = (uint64_t)in_RDI;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(in_stack_ffffffffffffffb0,elem);
  }
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}